

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceMemoryVkImpl.cpp
# Opt level: O2

Bool __thiscall
Diligent::DeviceMemoryVkImpl::IsCompatible(DeviceMemoryVkImpl *this,IDeviceObject *pResource)

{
  VulkanLogicalDevice *this_00;
  TextureVkImpl *pTVar1;
  BufferVkImpl *this_01;
  VkBuffer vkBuffer;
  undefined4 uVar2;
  RefCntAutoPtr<Diligent::IBufferVk> pBuffer;
  RefCntAutoPtr<Diligent::ITextureVk> pTexture;
  string msg;
  RefCntAutoPtr<Diligent::IBufferVk> local_58;
  RefCntAutoPtr<Diligent::ITextureVk> local_50;
  string local_48;
  
  this_00 = (((this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
             .m_pDevice)->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  RefCntAutoPtr<Diligent::ITextureVk>::RefCntAutoPtr
            (&local_50,&pResource->super_IObject,(INTERFACE_ID *)IID_TextureVk);
  if (local_50.m_pObject == (ITextureVk *)0x0) {
    RefCntAutoPtr<Diligent::IBufferVk>::RefCntAutoPtr
              (&local_58,&pResource->super_IObject,(INTERFACE_ID *)IID_BufferVk);
    if (local_58.m_pObject == (IBufferVk *)0x0) {
      FormatString<char[26]>(&local_48,(char (*) [26])"unsupported resource type");
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"IsCompatible",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceMemoryVkImpl.cpp"
                 ,0xae);
      std::__cxx11::string::~string((string *)&local_48);
      uVar2 = 0;
    }
    else {
      this_01 = RefCntAutoPtr<Diligent::IBufferVk>::ConstPtr<Diligent::BufferVkImpl>(&local_58);
      vkBuffer = BufferVkImpl::GetVkBuffer(this_01);
      VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
                ((VkMemoryRequirements *)&local_48,this_00,vkBuffer);
      uVar2 = local_48.field_2._M_allocated_capacity._0_4_;
    }
    RefCntAutoPtr<Diligent::IBufferVk>::Release(&local_58);
  }
  else {
    pTVar1 = RefCntAutoPtr<Diligent::ITextureVk>::ConstPtr<Diligent::TextureVkImpl>(&local_50);
    VulkanUtilities::VulkanLogicalDevice::GetImageMemoryRequirements
              ((VkMemoryRequirements *)&local_48,this_00,(pTVar1->m_VulkanImage).m_VkObject);
    uVar2 = local_48.field_2._M_allocated_capacity._0_4_;
  }
  RefCntAutoPtr<Diligent::ITextureVk>::Release(&local_50);
  return ((uint)uVar2 >> (this->m_MemoryTypeIndex & 0x1f) & 1) != 0;
}

Assistant:

Bool DeviceMemoryVkImpl::IsCompatible(IDeviceObject* pResource) const
{
    const auto& LogicalDevice = m_pDevice->GetLogicalDevice();

    uint32_t memoryTypeBits = 0;
    if (RefCntAutoPtr<ITextureVk> pTexture{pResource, IID_TextureVk})
    {
        const auto* pTexVk = pTexture.ConstPtr<TextureVkImpl>();
        memoryTypeBits     = LogicalDevice.GetImageMemoryRequirements(pTexVk->GetVkImage()).memoryTypeBits;
    }
    else if (RefCntAutoPtr<IBufferVk> pBuffer{pResource, IID_BufferVk})
    {
        const auto* pBuffVk = pBuffer.ConstPtr<BufferVkImpl>();
        memoryTypeBits      = LogicalDevice.GetBufferMemoryRequirements(pBuffVk->GetVkBuffer()).memoryTypeBits;
    }
    else
    {
        UNEXPECTED("unsupported resource type");
    }
    return (memoryTypeBits & (1u << m_MemoryTypeIndex)) != 0;
}